

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_namespace::run_impl(statement_namespace *this)

{
  stack_pointer psVar1;
  _Elt_pointer ppsVar2;
  statement_base *psVar3;
  undefined *puVar4;
  domain_type *domain;
  _Elt_pointer ppsVar5;
  scope_guard sVar6;
  _Map_pointer pppsVar7;
  stack_pointer this_00;
  _Elt_pointer ppsVar8;
  element_type *peVar9;
  scope_guard scope;
  var local_120;
  scope_guard local_118;
  namespace_t local_110;
  element_type *local_100;
  statement_namespace *local_f8;
  undefined1 local_f0 [96];
  domain_type local_90;
  
  sVar6.context = &(this->super_statement_base).context;
  peVar9 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar1 = *(peVar9->super_runtime_type).storage.fiber_stack;
  this_00 = &(peVar9->super_runtime_type).storage.m_data;
  if (psVar1 != (stack_pointer)0x0) {
    this_00 = psVar1;
  }
  local_118.context = sVar6.context;
  stack_type<cs::domain_type,_std::allocator>::push<>(this_00);
  ppsVar8 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar2 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar8 != ppsVar2) {
    ppsVar5 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar7 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    local_100 = peVar9;
    local_f8 = this;
    do {
      puVar4 = current_process;
      psVar3 = *ppsVar8;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar4 + 0xd0),(void *)0x0);
      }
      (*psVar3->_vptr_statement_base[3])(psVar3);
      ppsVar8 = ppsVar8 + 1;
      if (ppsVar8 == ppsVar5) {
        ppsVar8 = pppsVar7[1];
        pppsVar7 = pppsVar7 + 1;
        ppsVar5 = ppsVar8 + 0x40;
      }
      sVar6.context = local_118.context;
      this = local_f8;
      peVar9 = local_100;
    } while (ppsVar8 != ppsVar2);
  }
  domain = domain_manager::get_domain
                     (&((((((sVar6.context)->
                           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                         ->instance).
                         super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_runtime_type).storage);
  domain_type::domain_type(&local_90,domain);
  scope_guard::~scope_guard(&local_118);
  local_110.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::name_space,std::allocator<cs::name_space>,cs::domain_type>
            (&local_110.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (name_space **)&local_110,(allocator<cs::name_space> *)local_f0,&local_90);
  make_namespace((cs *)&local_120,&local_110);
  domain_manager::add_var_no_return<std::__cxx11::string&>
            (&(peVar9->super_runtime_type).storage,&this->mName,&local_120,true);
  cs_impl::any::recycle(&local_120);
  if (local_110.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  domain_type::~domain_type(&local_90);
  return;
}

Assistant:

void statement_namespace::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		context->instance->storage.add_var_no_return(this->mName,
		make_namespace(make_shared_namespace<name_space>([this] {
			scope_guard scope(context);
			for (auto &ptr: mBlock)
			{
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(),
					                ptr->get_raw_code(), e.what());
				}
			}
			return scope.get();
		}())), true);
	}